

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

char units::getMatchCharacter(char mchar)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,mchar);
  if (iVar1 == 0x28) {
    return ')';
  }
  if (iVar1 == 0x29) {
    return '(';
  }
  if (iVar1 == 0x3c) {
    return '>';
  }
  if (iVar1 != 0x3e) {
    if (iVar1 == 0x7d) {
      return '{';
    }
    if (iVar1 != 0x5d) {
      if (iVar1 != 0x7b) {
        if (iVar1 == 0x5b) {
          iVar1 = 0x5d;
        }
        return (char)iVar1;
      }
      return '}';
    }
    return '[';
  }
  return '<';
}

Assistant:

static char getMatchCharacter(char mchar)
{
    switch (mchar) {
        case '{':
            return '}';
        case '[':
            return ']';
        case '(':
            return ')';
        case '<':
            return '>';
        case '}':
            return '{';
        case ']':
            return '[';
        case ')':
            return '(';
        case '>':
            return '<';
        case '\'':
        case '"':
        case '`':
        default:
            return mchar;
    }
}